

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O2

sym_t * get_sym(char *id)

{
  uint uVar1;
  sym_t *__s1;
  int iVar2;
  ulong uVar3;
  symtbl_t *psVar4;
  
  psVar4 = scope;
  do {
    uVar1 = psVar4->num_syms;
    uVar3 = 0;
    while (uVar1 != uVar3) {
      __s1 = psVar4->syms[uVar3];
      iVar2 = strcmp(__s1->id,id);
      uVar3 = uVar3 + 1;
      if (iVar2 == 0) {
        return __s1;
      }
    }
    psVar4 = psVar4->parent;
  } while (psVar4 != (symtbl_t *)0x0);
  return (sym_t *)0x0;
}

Assistant:

sym_t* get_sym(const char *id)
{
    unsigned int i;
    symtbl_t* scp = scope;
    do
    {
        for (i = 0; i < scp->num_syms; i++)
        {
            if (strcmp(scp->syms[i]->id, id) == 0)
                return scp->syms[i];
        }
        scp = scp->parent;
    } while (scp != NULL);

    return NULL;
}